

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.cpp
# Opt level: O0

void __thiscall Scs::Server::DisconnectClient(Server *this,ClientID clientId)

{
  bool bVar1;
  __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *peVar2;
  shared_ptr<Scs::Server::ClientConnection> *connection;
  iterator __end1;
  iterator __begin1;
  ClientConnectionList *__range1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  ClientID clientId_local;
  Server *this_local;
  
  lock._M_device._4_4_ = clientId;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m_connectionListMutex);
  bVar1 = std::__cxx11::
          list<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
          ::empty(&this->m_connectionList);
  if (!bVar1) {
    __end1 = std::__cxx11::
             list<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
             ::begin(&this->m_connectionList);
    connection = (shared_ptr<Scs::Server::ClientConnection> *)
                 std::__cxx11::
                 list<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
                 ::end(&this->m_connectionList);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&connection), bVar1) {
      this_00 = (__shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::_List_iterator<std::shared_ptr<Scs::Server::ClientConnection>_>::operator*
                             (&__end1);
      peVar2 = std::
               __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_00);
      if (peVar2->clientID == lock._M_device._4_4_) {
        peVar2 = std::
                 __shared_ptr_access<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(this_00);
        peVar2->connected = false;
        break;
      }
      std::_List_iterator<std::shared_ptr<Scs::Server::ClientConnection>_>::operator++(&__end1);
    }
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void Server::DisconnectClient(ClientID clientId)
{
	std::lock_guard<std::mutex> lock(m_connectionListMutex);
	if (m_connectionList.empty())
		return;
	for (auto & connection : m_connectionList)
	{
		if (connection->clientID == clientId)
		{
			connection->connected = false;
			return;
		}
	}
}